

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * formatCodePoint_abi_cxx11_(string *__return_storage_ptr__,ThreadId threadId)

{
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar1;
  string *extraout_RAX_01;
  undefined1 local_b8 [8];
  FrameState vf;
  ThreadState vt;
  
  (*(debugger.super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_IDebugger[0xc])
            (&vf.scopeIds.
              super__Vector_base<chatra::debugger::ScopeId,_std::allocator<chatra::debugger::ScopeId>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             debugger.super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,threadId);
  if ((pointer)vt.threadId ==
      vt.frameIds.
      super__Vector_base<chatra::debugger::FrameId,_std::allocator<chatra::debugger::FrameId>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"@unknown","");
    psVar1 = extraout_RAX_00;
  }
  else {
    (*(debugger.super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->_vptr_IDebugger[0xd])
              (local_b8,debugger.
                        super___shared_ptr<chatra::debugger::IDebugger,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,threadId,*(undefined8 *)vt.threadId);
    formatCodePoint_abi_cxx11_(__return_storage_ptr__,(CodePoint *)&vf.frameType);
    if (vf.current._64_8_ != 0) {
      operator_delete((void *)vf.current._64_8_);
    }
    if ((size_type *)vf.current.packageName.field_2._8_8_ != &vf.current.fileName._M_string_length)
    {
      operator_delete((void *)vf.current.packageName.field_2._8_8_);
    }
    psVar1 = (string *)&vf.current.packageName._M_string_length;
    if ((string *)vf._16_8_ != psVar1) {
      operator_delete((void *)vf._16_8_);
      psVar1 = extraout_RAX;
    }
  }
  if (vt.threadId != 0) {
    operator_delete((void *)vt.threadId);
    psVar1 = extraout_RAX_01;
  }
  return psVar1;
}

Assistant:

static std::string formatCodePoint(cha::d::ThreadId threadId) {
	auto vt = debugger->getThreadState(threadId);
	if (vt.frameIds.empty())
		return "@unknown";

	auto vf = debugger->getFrameState(threadId, vt.frameIds.front());
	return formatCodePoint(vf.current);
}